

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

void __thiscall
QSocks5SocketEnginePrivate::setErrorState
          (QSocks5SocketEnginePrivate *this,Socks5State state,Socks5Error socks5error)

{
  QAbstractSocketEngine *this_00;
  int iVar1;
  SocketError error;
  QMetaObject *pQVar2;
  long in_FS_OFFSET;
  QArrayData *local_60 [3];
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketEngine **)&(this->super_QAbstractSocketEnginePrivate).field_0x8;
  switch(socks5error) {
  case SocksFailure:
    pQVar2 = &QSocks5SocketEngine::staticMetaObject;
    iVar1 = 0x27c574;
    goto LAB_00238637;
  case ConnectionNotAllowed:
    QMetaObject::tr((char *)&local_48,(char *)&QSocks5SocketEngine::staticMetaObject,0x27c593);
    error = SocketAccessError;
    break;
  case NetworkUnreachable:
    pQVar2 = &QAbstractSocket::staticMetaObject;
    iVar1 = 0x260a6d;
    goto LAB_00238637;
  case HostUnreachable:
    QMetaObject::tr((char *)&local_48,(char *)&QAbstractSocket::staticMetaObject,0x25ddaa);
    error = HostNotFoundError;
    break;
  case ConnectionRefused:
    QMetaObject::tr((char *)&local_48,(char *)&QAbstractSocket::staticMetaObject,0x27d50c);
    error = ConnectionRefusedError;
    break;
  case TTLExpired:
    pQVar2 = &QSocks5SocketEngine::staticMetaObject;
    iVar1 = 0x27c5bc;
LAB_00238637:
    QMetaObject::tr((char *)&local_48,(char *)pQVar2,iVar1);
    error = NetworkError;
    break;
  case CommandNotSupported:
    iVar1 = 0x27c5c8;
    goto LAB_00238664;
  case AddressTypeNotSupported:
    iVar1 = 0x27c5e6;
LAB_00238664:
    QMetaObject::tr((char *)&local_48,(char *)&QSocks5SocketEngine::staticMetaObject,iVar1);
    error = UnsupportedSocketOperationError;
    break;
  default:
    QMetaObject::tr((char *)local_60,(char *)&QSocks5SocketEngine::staticMetaObject,0x27c601);
    QString::arg_impl((longlong)&local_48,(int)local_60,socks5error,(QChar)0x10);
    QAbstractSocketEngine::setError(this_00,UnknownSocketError,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_60[0] == (QArrayData *)0x0) goto LAB_002386ab;
    LOCK();
    (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_002386ab;
    goto LAB_0023869c;
  }
  QAbstractSocketEngine::setError(this_00,error,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    local_60[0] = &(local_48.d.d)->super_QArrayData;
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_0023869c:
      QArrayData::deallocate(local_60[0],2,0x10);
    }
  }
LAB_002386ab:
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  setErrorState(this,state,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::setErrorState(Socks5State state, Socks5Error socks5error)
{
    Q_Q(QSocks5SocketEngine);
    switch (socks5error) {
    case SocksFailure:
        q->setError(QAbstractSocket::NetworkError,
                     QSocks5SocketEngine::tr("General SOCKSv5 server failure"));
        break;
    case ConnectionNotAllowed:
        q->setError(QAbstractSocket::SocketAccessError,
                     QSocks5SocketEngine::tr("Connection not allowed by SOCKSv5 server"));
        break;
    case NetworkUnreachable:
        q->setError(QAbstractSocket::NetworkError,
                    QAbstractSocket::tr("Network unreachable"));
        break;
    case HostUnreachable:
        q->setError(QAbstractSocket::HostNotFoundError,
                    QAbstractSocket::tr("Host not found"));
        break;
    case ConnectionRefused:
        q->setError(QAbstractSocket::ConnectionRefusedError,
                    QAbstractSocket::tr("Connection refused"));
        break;
    case TTLExpired:
        q->setError(QAbstractSocket::NetworkError,
                     QSocks5SocketEngine::tr("TTL expired"));
        break;
    case CommandNotSupported:
        q->setError(QAbstractSocket::UnsupportedSocketOperationError,
                     QSocks5SocketEngine::tr("SOCKSv5 command not supported"));
        break;
    case AddressTypeNotSupported:
        q->setError(QAbstractSocket::UnsupportedSocketOperationError,
                     QSocks5SocketEngine::tr("Address type not supported"));
        break;

    default:
        q->setError(QAbstractSocket::UnknownSocketError,
                     QSocks5SocketEngine::tr("Unknown SOCKSv5 proxy error code 0x%1").arg(int(socks5error), 16));
        break;
    }

    setErrorState(state, QString());
}